

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O2

AllocaInst * __thiscall
LLVMBC::LLVMContext::
construct<LLVMBC::AllocaInst,LLVMBC::PointerType*&,LLVMBC::Type*&,LLVMBC::Value*&>
          (LLVMContext *this,PointerType **u,Type **u_1,Value **u_2)

{
  AllocaInst *this_00;
  
  this_00 = (AllocaInst *)allocate(this,0x78,8);
  if (this_00 != (AllocaInst *)0x0) {
    AllocaInst::AllocaInst(this_00,&(*u)->super_Type,*u_1,*u_2);
    append_typed_destructor<LLVMBC::AllocaInst>(this,this_00);
    return this_00;
  }
  std::terminate();
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}